

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O0

void __thiscall
IRT::BlockFormerVisitor::Visit(BlockFormerVisitor *this,LabelStatement *label_statement)

{
  LabelStatement *this_00;
  Label local_38;
  LabelStatement *local_18;
  LabelStatement *label_statement_local;
  BlockFormerVisitor *this_local;
  
  local_18 = label_statement;
  label_statement_local = (LabelStatement *)this;
  this_00 = (LabelStatement *)operator_new(0x28);
  Label::Label(&local_38,&local_18->label_);
  LabelStatement::LabelStatement(this_00,&local_38);
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.statement_ = (Statement *)this_00;
  Label::~Label(&local_38);
  return;
}

Assistant:

void BlockFormerVisitor::Visit(LabelStatement* label_statement) {
  tos_value_.statement_ = new LabelStatement(label_statement->label_);
}